

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

ZSTD_compressionParameters *
ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_compressionParameters *pZVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  ZSTD_compressionParameters cPar;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ZSTD_compressionParameters cp;
  undefined4 local_1c;
  undefined4 uStack_18;
  undefined8 uStack_14;
  
  sVar8 = dictSize;
  if ((1 < mode - ZSTD_cpm_createCDict) && (mode != ZSTD_cpm_noAttachDict)) {
    if (mode != ZSTD_cpm_attachDict) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1b21,"U64 ZSTD_getCParamRowSize(U64, size_t, ZSTD_cParamMode_e)");
    }
    sVar8 = 0;
  }
  uVar9 = 0xffffffffffffffff;
  if (srcSizeHint != 0xffffffffffffffff || sVar8 != 0) {
    lVar10 = 500;
    if (sVar8 == 0) {
      lVar10 = 0;
    }
    lVar11 = 0;
    if (srcSizeHint == 0xffffffffffffffff) {
      lVar11 = lVar10;
    }
    uVar9 = sVar8 + srcSizeHint + lVar11;
  }
  lVar10 = (ulong)(uVar9 < 0x20001) + (ulong)(uVar9 < 0x40001) + (ulong)(uVar9 < 0x4001);
  if (compressionLevel == 0) {
    uVar9 = 3;
  }
  else if (compressionLevel < 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0x16;
    if (compressionLevel < 0x16) {
      uVar9 = (ulong)(uint)compressionLevel;
    }
  }
  pZVar1 = ZSTD_defaultCParameters[lVar10] + uVar9;
  uVar3 = pZVar1->searchLog;
  uVar4 = pZVar1->windowLog;
  uVar5 = pZVar1->chainLog;
  uVar6 = pZVar1->hashLog;
  cPar.hashLog = uVar6;
  cPar.chainLog = uVar5;
  cPar.windowLog = uVar4;
  puVar2 = (undefined8 *)(lVar10 * 0x284 + 0x84a41c + uVar9 * 0x1c);
  uStack_14 = puVar2[1];
  uStack_18 = (undefined4)((ulong)*puVar2 >> 0x20);
  if (compressionLevel < 0) {
    iVar7 = -0x20000;
    if (-0x20000 < compressionLevel) {
      iVar7 = compressionLevel;
    }
    uStack_14._4_4_ = (undefined4)((ulong)uStack_14 >> 0x20);
    uStack_14 = CONCAT44(uStack_14._4_4_,-iVar7);
  }
  cPar.searchLog = uVar3;
  cPar.minMatch = uStack_18;
  cPar.targetLength = (undefined4)uStack_14;
  cPar.strategy = uStack_14._4_4_;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize,mode,ZSTD_ps_auto);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    U64 const rSize = ZSTD_getCParamRowSize(srcSizeHint, dictSize, mode);
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);

    /* row */
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    else if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    else if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    else row = compressionLevel;

    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        DEBUGLOG(5, "ZSTD_getCParams_internal selected tableID: %u row: %u strat: %u", tableID, row, (U32)cp.strategy);
        /* acceleration factor */
        if (compressionLevel < 0) {
            int const clampedCompressionLevel = MAX(ZSTD_minCLevel(), compressionLevel);
            cp.targetLength = (unsigned)(-clampedCompressionLevel);
        }
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize, mode, ZSTD_ps_auto);
    }
}